

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  uchar (*pk_parity) [4];
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  FILE *__stream;
  size_t sVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *psVar13;
  secp256k1_scratch *scratch;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong uVar19;
  secp256k1_fe *psVar20;
  void *pvVar21;
  byte *pbVar22;
  ulong uVar23;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_scalar *psVar24;
  secp256k1_context *extraout_RDX;
  secp256k1_context *psVar25;
  int iVar26;
  uchar auVar27 [4];
  secp256k1_gej *a;
  secp256k1_ge_storage (*r_00) [2];
  _func_void_char_ptr_void_ptr *p_Var28;
  secp256k1_keypair *keypair;
  uint uVar29;
  long lVar30;
  undefined1 *puVar31;
  uint uVar32;
  ulong uVar33;
  secp256k1_scalar *psVar34;
  undefined1 *puVar35;
  uint64_t *puVar36;
  secp256k1_ge *psVar37;
  undefined8 *puVar38;
  byte *pbVar39;
  ulong uVar40;
  secp256k1_context *psVar41;
  secp256k1_ge *psVar42;
  uchar *na;
  secp256k1_xonly_pubkey *psVar43;
  uint64_t uVar44;
  ulong uVar45;
  char cVar46;
  int iVar47;
  secp256k1_scalar sVar48;
  char *pcVar49;
  uchar *puVar50;
  secp256k1_context *a_00;
  bool bVar51;
  byte bVar52;
  undefined1 auVar53 [16];
  FILE *pFStack_1b30;
  ulong uStack_1b28;
  ulong uStack_1b20;
  uchar auStack_1b14 [4];
  secp256k1_context *psStack_1b10;
  undefined1 auStack_1b04 [4];
  undefined1 *puStack_1b00;
  undefined1 *puStack_1af8;
  secp256k1_gej *psStack_1af0;
  secp256k1_scalar sStack_1ae4;
  undefined1 auStack_1ae0 [32];
  undefined1 auStack_1ac0 [16];
  undefined1 auStack_1ab0 [16];
  undefined1 auStack_1aa0 [16];
  undefined4 uStack_1a90;
  undefined1 auStack_1a80 [16];
  undefined1 auStack_1a70 [16];
  int iStack_1a54;
  undefined1 auStack_1a50 [96];
  undefined1 auStack_19f0 [16];
  undefined1 auStack_19e0 [16];
  uint64_t uStack_19c8;
  undefined4 uStack_19bc;
  ulong uStack_19b8;
  _func_void_char_ptr_void_ptr *p_Stack_19b0;
  uint64_t *puStack_19a8;
  _func_void_char_ptr_void_ptr *p_Stack_19a0;
  secp256k1_scratch *psStack_1998;
  ulong uStack_1990;
  secp256k1_xonly_pubkey *psStack_1988;
  undefined1 *puStack_1980;
  ulong uStack_1978;
  undefined1 auStack_1970 [16];
  undefined1 auStack_1960 [16];
  undefined1 auStack_1950 [16];
  undefined1 auStack_1940 [16];
  undefined1 auStack_1810 [32];
  byte abStack_17f0 [8];
  undefined8 auStack_17e8 [3];
  undefined1 auStack_17d0 [16];
  undefined1 auStack_17c0 [16];
  uchar auStack_17b0 [4];
  uchar auStack_17ac [4];
  int iStack_17a8;
  int iStack_17a4;
  secp256k1_keypair sStack_1530;
  secp256k1_context asStack_14d0 [5];
  undefined1 auStack_1050 [16];
  undefined1 auStack_1040 [16];
  uint64_t uStack_1030;
  uint64_t uStack_1028;
  undefined1 auStack_1020 [32];
  undefined4 uStack_1000;
  undefined4 uStack_ffc;
  int iStack_ff8;
  int iStack_ff4;
  int iStack_ff0;
  undefined1 auStack_d50 [32];
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  int iStack_d28;
  int iStack_d24;
  uint64_t auStack_d20 [2];
  uchar auStack_d10 [8];
  uchar auStack_d08 [8];
  uchar auStack_d00 [4];
  uchar auStack_cfc [4];
  int aiStack_cf8 [4];
  secp256k1_context asStack_ce8 [5];
  secp256k1_ge sStack_870;
  undefined1 auStack_808 [8];
  undefined1 auStack_800 [152];
  secp256k1_context asStack_768 [9];
  secp256k1_fe *psStack_48;
  
  bVar52 = 0;
  secp256k1_fe_verify(r);
  uVar23 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar33 = (uVar23 >> 0x34) + r->n[1];
  uVar18 = (uVar33 >> 0x34) + r->n[2];
  uVar40 = uVar18 & 0xfffffffffffff;
  uVar18 = (uVar18 >> 0x34) + r->n[3];
  uVar19 = (uVar18 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar23 = uVar23 & 0xfffffffffffff;
  uVar45 = (ulong)(0xffffefffffc2e < uVar23 &&
                  ((uVar40 & uVar33 & uVar18) == 0xfffffffffffff && uVar19 == 0xffffffffffff)) |
           uVar19 >> 0x30;
  uVar23 = uVar45 * 0x1000003d1 + uVar23;
  uVar33 = (uVar23 >> 0x34) + (uVar33 & 0xfffffffffffff);
  psVar34 = (secp256k1_scalar *)((uVar33 >> 0x34) + uVar40);
  uVar18 = ((ulong)psVar34 >> 0x34) + (uVar18 & 0xfffffffffffff);
  uVar19 = (uVar18 >> 0x34) + uVar19;
  if ((uint)(ushort)(uVar19 >> 0x30) == (uint)uVar45) {
    r->n[0] = uVar23 & 0xfffffffffffff;
    r->n[1] = uVar33 & 0xfffffffffffff;
    r->n[2] = (ulong)psVar34 & 0xfffffffffffff;
    r->n[3] = uVar18 & 0xfffffffffffff;
    r->n[4] = uVar19 & 0xffffffffffff;
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_normalize_cold_1();
  psStack_48 = r;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar18) {
    lVar9 = strtol(*(char **)(psVar34 + 2),(char **)0x0,0);
    count = (int)lVar9;
  }
  pcVar49 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar18) {
    pcVar49 = *(char **)(psVar34 + 4);
  }
  asStack_14d0[0].ecmult_gen_ctx.built = 0;
  asStack_14d0[0].ecmult_gen_ctx.scalar_offset = 0;
  asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  pFStack_1b30 = (FILE *)(uVar18 & 0xffffffff);
  auStack_1a50._64_8_ = psVar34;
  if ((pcVar49 == (char *)0x0) || (*pcVar49 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00113e33;
    sVar10 = fread(asStack_14d0,1,0x10,__stream);
    if (sVar10 != 0x10) goto LAB_00113e33;
    goto LAB_001113b1;
  }
  iVar47 = 0;
  while ((((iVar47 < 0x10 && (*pcVar49 != '\0')) && (pcVar49[1] != '\0')) &&
         (iVar6 = __isoc99_sscanf(pcVar49,"%2hx",auStack_800), iVar6 == 1))) {
    *(undefined1 *)((long)asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + (long)iVar47 + -8) =
         auStack_800[0];
    pcVar49 = pcVar49 + 2;
    iVar47 = iVar47 + 1;
  }
LAB_001113be:
  na = (uchar *)((ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  puStack_1b00 = (undefined1 *)((ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x38);
  puStack_1af8 = (undefined1 *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff);
  psStack_1af0 = (secp256k1_gej *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff);
  lVar9 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_14d0[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_800._0_8_ = 0xbb67ae856a09e667;
  auStack_800._8_8_ = 0xa54ff53a3c6ef372;
  auStack_800._16_8_ = 0x9b05688c510e527f;
  auStack_800._24_8_ = 0x5be0cd191f83d9ab;
  auStack_800._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_800,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_800,(uchar *)asStack_14d0,0x10);
  puVar50 = auStack_d50;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_800,puVar50);
  uVar1 = auStack_1a50._64_8_;
  do {
    psVar20 = (secp256k1_fe *)0x0;
    uVar23 = 0;
    do {
      uVar23 = (ulong)puVar50[(long)psVar20] | uVar23 << 8;
      psVar20 = (secp256k1_fe *)((long)psVar20->n + 1);
    } while (psVar20 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar9] = uVar23;
    lVar9 = lVar9 + 1;
    puVar50 = puVar50 + 8;
  } while (lVar9 != 4);
  if (4 < (int)(uint)pFStack_1b30) {
    lVar9 = strtol(*(char **)(auStack_1a50._64_8_ + 0x18),(char **)0x0,0);
    num_cores = (uint32_t)lVar9;
    uVar23 = strtol(*(char **)(uVar1 + 0x20),(char **)0x0,0);
    this_core = (uint32_t)uVar23;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00113e59:
      main_cold_2();
      return;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar23 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar41 = (secp256k1_context *)0xd0;
  psVar11 = (secp256k1_ge *)malloc(0xd0);
  if (psVar11 != (secp256k1_ge *)0x0) {
    psVar41 = (secp256k1_context *)0x130;
    psVar12 = (secp256k1_gej *)malloc(0x130);
    if (psVar12 != (secp256k1_gej *)0x0) {
      psVar41 = (secp256k1_context *)0x130;
      psVar13 = (secp256k1_gej *)malloc(0x130);
      if (psVar13 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        asStack_14d0[0].ecmult_gen_ctx.built = 7;
        secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
        secp256k1_gej_set_infinity((secp256k1_gej *)auStack_800);
        uVar29 = 0xff;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
          bVar51 = (7U >> (uVar29 & 0x1f) & 1) != 0;
          psVar20 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar20 >> 8),bVar51);
          if ((uVar29 < 0x20) && (bVar51)) {
            psVar20 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,
                       &secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar51 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar51);
        psVar41 = (secp256k1_context *)auStack_d50;
        secp256k1_gej_double_var
                  ((secp256k1_gej *)psVar41,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0);
        iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar41,&secp256k1_ge_const_g);
        if (iVar47 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_d50);
          lVar9 = -0x98;
          do {
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_d50,(secp256k1_gej *)auStack_d50,
                       (secp256k1_gej *)auStack_800,psVar20);
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0
                      );
            memcpy((void *)((long)psVar12[1].x.n + lVar9),(secp256k1_gej *)auStack_800,0x98);
            if (lVar9 != 0) {
              secp256k1_gej_double_var
                        ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,
                         (secp256k1_fe *)0x0);
            }
            lVar9 = lVar9 + 0x98;
          } while (lVar9 == 0);
          secp256k1_gej_neg(psVar13,(secp256k1_gej *)auStack_d50);
          secp256k1_gej_add_var(psVar13 + 1,psVar13,psVar12,psVar20);
          lVar9 = 0;
          do {
            secp256k1_gej_verify((secp256k1_gej *)((long)(psVar13->x).n + lVar9));
            lVar9 = lVar9 + 0x98;
          } while (lVar9 == 0x98);
          psVar20 = &psVar13->z;
          lVar9 = -1;
          lVar30 = 0;
          psVar37 = psVar11;
          do {
            if ((int)psVar20[1].n[0] == 0) {
              if (lVar9 == -1) {
                uVar44 = psVar20->n[0];
                uVar5 = psVar20->n[1];
                auVar53 = *(undefined1 (*) [16])(psVar20->n + 2);
                uVar4 = *(undefined4 *)((long)psVar20->n + 0x24);
                iVar47 = psVar20->magnitude;
                iVar6 = psVar20->normalized;
                *(int *)((psVar37->x).n + 4) = (int)psVar20->n[4];
                *(undefined4 *)((long)(psVar37->x).n + 0x24) = uVar4;
                (psVar37->x).magnitude = iVar47;
                (psVar37->x).normalized = iVar6;
                *(undefined1 (*) [16])((psVar37->x).n + 2) = auVar53;
                (psVar37->x).n[0] = uVar44;
                (psVar37->x).n[1] = uVar5;
                lVar9 = lVar30;
              }
              else {
                secp256k1_fe_mul(&psVar37->x,&psVar11[lVar9].x,psVar20);
                lVar9 = lVar30;
              }
            }
            else {
              secp256k1_ge_set_infinity(psVar37);
            }
            lVar30 = lVar30 + 1;
            psVar37 = psVar37 + 1;
            psVar20 = (secp256k1_fe *)(psVar20[3].n + 1);
          } while (lVar30 == 1);
          if (lVar9 != -1) {
            psVar41 = (secp256k1_context *)auStack_d50;
            secp256k1_fe_inv_var((secp256k1_fe *)psVar41,&psVar11[lVar9].x);
            if ((lVar9 != 0) && (psVar13->infinity == 0)) {
              psVar41 = (secp256k1_context *)auStack_d50;
              secp256k1_fe_mul(&psVar11[lVar9].x,(secp256k1_fe *)psVar11,(secp256k1_fe *)psVar41);
              secp256k1_fe_mul((secp256k1_fe *)psVar41,(secp256k1_fe *)psVar41,&psVar13[lVar9].z);
              lVar9 = 0;
            }
            if (psVar13[lVar9].infinity != 0) goto LAB_00113ecf;
            psVar20 = &psVar11[lVar9].x;
            *(undefined4 *)(psVar20->n + 4) = uStack_d30;
            *(undefined4 *)((long)psVar20->n + 0x24) = uStack_d2c;
            *(int *)(psVar20->n + 4 + 1) = iStack_d28;
            psVar20->normalized = iStack_d24;
            *(undefined1 (*) [16])(psVar11[lVar9].x.n + 2) = auStack_d50._16_16_;
            psVar11[lVar9].x.n[0] = auStack_d50._0_8_;
            psVar11[lVar9].x.n[1] = auStack_d50._8_8_;
            lVar9 = 0;
            a = psVar13;
            do {
              if (a->infinity == 0) {
                psVar37 = (secp256k1_ge *)((long)(psVar11->x).n + lVar9);
                secp256k1_ge_set_gej_zinv(psVar37,a,(secp256k1_fe *)psVar37);
              }
              lVar9 = lVar9 + 0x68;
              a = a + 1;
            } while (lVar9 == 0x68);
            lVar9 = 0;
            do {
              secp256k1_ge_verify((secp256k1_ge *)((long)(psVar11->x).n + lVar9));
              lVar9 = lVar9 + 0x68;
            } while (lVar9 == 0x68);
          }
          r_00 = secp256k1_ecmult_gen_prec_table;
          lVar9 = 0;
          do {
            psVar41 = (secp256k1_context *)((long)(psVar11->x).n + lVar9);
            psVar25 = psVar41;
            secp256k1_ge_verify((secp256k1_ge *)psVar41);
            if (*(int *)((long)(&psVar11->y + 1) + lVar9) != 0) goto LAB_00113e70;
            secp256k1_ge_to_storage(*r_00,(secp256k1_ge *)psVar41);
            lVar9 = lVar9 + 0x68;
            r_00 = (secp256k1_ge_storage (*) [2])((long)r_00 + 0x40);
          } while (lVar9 == 0x68);
          free(psVar13);
          free(psVar12);
          free(psVar11);
          secp256k1_gej_set_ge((secp256k1_gej *)auStack_800,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_800,gen);
          iVar47 = 0x80;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0
                      );
            iVar47 = iVar47 + -1;
          } while (iVar47 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_800,gen_00);
          iVar47 = count;
joined_r0x00111916:
          count = iVar47 + -1;
          if (iVar47 == 0) {
            testrand256((uchar *)asStack_14d0);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,asStack_14d0[0].ecmult_gen_ctx._0_8_ & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x38,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
            puts("no problems found");
            return;
          }
          psVar41 = secp256k1_context_create(1);
          testrand256(abStack_17f0);
          psStack_1b10 = psVar41;
          iVar47 = secp256k1_context_randomize(psVar41,abStack_17f0);
          if (iVar47 == 0) goto LAB_00113ed4;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_800);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_d50,(secp256k1_gej *)auStack_800);
          iVar47 = 1;
          lVar9 = -0x4e0;
          psVar12 = (secp256k1_gej *)auStack_800;
          do {
            psVar13 = psVar12 + 1;
            secp256k1_gej_add_ge(psVar13,psVar12,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_808 + lVar9),psVar13);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)asStack_14d0);
              secp256k1_gej_rescale(psVar13,(secp256k1_fe *)asStack_14d0);
            }
            auStack_17d0._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_17d0);
            secp256k1_ecmult_gen
                      (&psStack_1b10->ecmult_gen_ctx,(secp256k1_gej *)asStack_14d0,
                       (secp256k1_scalar *)auStack_17d0);
            psVar25 = (secp256k1_context *)auStack_1050;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar25,(secp256k1_gej *)asStack_14d0);
            if (*(int *)(auStack_800 + lVar9 + 0x58) != 0) goto LAB_00113e75;
            if (iStack_ff0 != 0) goto LAB_00113e7a;
            psVar25 = (secp256k1_context *)auStack_1050;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar25,(secp256k1_fe *)(auStack_808 + lVar9)
                                      );
            if (iVar6 == 0) goto LAB_00113e7f;
            psVar25 = (secp256k1_context *)auStack_1020;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar25,
                                       (secp256k1_fe *)(auStack_800 + lVar9 + 0x28));
            if (iVar6 == 0) goto LAB_00113e84;
            iVar47 = iVar47 + 1;
            lVar9 = lVar9 + 0x68;
            psVar12 = psVar13;
          } while (lVar9 != 0);
          uVar23 = 0;
          puVar35 = auStack_d50;
          lVar9 = 0;
          do {
            psVar25 = (secp256k1_context *)(puVar35 + (uVar23 / 0xd) * -0x548);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)asStack_14d0,(secp256k1_ge *)(auStack_d50 + lVar9));
            iVar47 = secp256k1_ge_eq_var((secp256k1_ge *)psVar25,(secp256k1_ge *)asStack_14d0);
            if (iVar47 == 0) goto LAB_00113e89;
            lVar9 = lVar9 + 0x68;
            puVar35 = puVar35 + 0x3a8;
            uVar23 = uVar23 + 9;
          } while (lVar9 != 0x548);
          psVar41 = (secp256k1_context *)auStack_d50;
          secp256k1_ge_verify((secp256k1_ge *)psVar41);
          if (aiStack_cf8[2] == 0) goto LAB_00113ed9;
          psVar41 = (secp256k1_context *)auStack_800;
          secp256k1_gej_verify((secp256k1_gej *)psVar41);
          if (auStack_800._144_4_ == 0) goto LAB_00113ede;
          lVar9 = 0xc;
          psVar41 = asStack_ce8;
          a_00 = (secp256k1_context *)(auStack_800 + 0x98);
          do {
            psVar25 = psVar41;
            secp256k1_ge_verify((secp256k1_ge *)psVar41);
            if ((psVar41->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00113e8e;
            psVar25 = a_00;
            secp256k1_gej_verify((secp256k1_gej *)a_00);
            if ((int)(a_00->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00113e93;
            a_00 = (secp256k1_context *)&(a_00->ecmult_gen_ctx).proj_blind.magnitude;
            psVar41 = (secp256k1_context *)&(psVar41->ecmult_gen_ctx).ge_offset.infinity;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          puStack_1b00 = auStack_d50;
          uStack_1b28 = 0;
          puStack_1af8 = (undefined1 *)0x0;
          do {
            bVar51 = true;
            if ((ulong)num_cores != 1) {
              puStack_1af8 = puStack_1af8 + -0x18fc812e5f4bd725;
              bVar51 = (uint32_t)
                       (((ulong)puStack_1af8 >> 0x20 ^ (ulong)puStack_1af8 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar51) {
              lVar9 = uStack_1b28 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_17d0,
                               (secp256k1_fe *)(auStack_800 + lVar9 + 0x60));
              lVar30 = 0;
              puVar35 = puStack_1b00;
              uVar23 = uStack_1b28;
              do {
                psVar11 = (secp256k1_ge *)(puVar35 + (uVar23 / 0xd) * -0x548);
                psVar12 = (secp256k1_gej *)(auStack_800 + lVar30);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,
                           (secp256k1_gej *)(auStack_800 + lVar9),(secp256k1_fe *)0x4ec4ec4ec4ec4ec5
                          );
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) {
                  main_cold_63();
LAB_00113e4a:
                  main_cold_62();
LAB_00113e4f:
                  main_cold_61();
LAB_00113e54:
                  main_cold_9();
                  goto LAB_00113e59;
                }
                if (uStack_1b28 != 0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)asStack_14d0,psVar12,
                             (secp256k1_ge *)(auStack_d50 + uStack_1b28 * 0x68));
                  iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                  if (iVar47 != 0) goto LAB_00111d41;
                  goto LAB_00113e54;
                }
LAB_00111d41:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,
                           (secp256k1_ge *)(auStack_d50 + uStack_1b28 * 0x68),(secp256k1_fe *)0x0);
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) goto LAB_00113e4a;
                iStack_ff0 = *(int *)(auStack_800 + lVar9 + 0x90);
                uStack_1030 = *(uint64_t *)(auStack_800 + lVar9 + 0x20);
                uStack_1028 = *(uint64_t *)(auStack_800 + lVar9 + 0x28);
                auStack_1040._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x18);
                auStack_1040._0_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x10);
                auStack_1050._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 8);
                auStack_1050._0_8_ = (((secp256k1_gej *)(auStack_800 + lVar9))->x).n[0];
                auStack_1020._0_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x30);
                auStack_1020._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x38);
                auStack_1020._16_16_ = *(undefined1 (*) [16])(auStack_800 + lVar9 + 0x40);
                uStack_1000 = *(undefined4 *)(auStack_800 + lVar9 + 0x50);
                uStack_ffc = *(undefined4 *)(auStack_800 + lVar9 + 0x54);
                iStack_ff8 = *(int *)(auStack_800 + lVar9 + 0x58);
                iStack_ff4 = *(int *)(auStack_800 + lVar9 + 0x5c);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,(secp256k1_ge *)auStack_1050,
                           (secp256k1_fe *)auStack_17d0);
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) goto LAB_00113e4f;
                lVar30 = lVar30 + 0x98;
                puVar35 = puVar35 + 0x68;
                uVar23 = uVar23 + 1;
              } while (lVar30 != 0x7b8);
            }
            uStack_1b28 = uStack_1b28 + 1;
            puStack_1b00 = puStack_1b00 + 0x68;
          } while (uStack_1b28 != 0xd);
          uVar23 = 0;
          puVar35 = auStack_d50;
          lVar9 = 0;
          do {
            psVar41 = asStack_14d0;
            secp256k1_gej_double((secp256k1_gej *)psVar41,(secp256k1_gej *)(auStack_800 + lVar9));
            psVar25 = psVar41;
            iVar47 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar41,
                                (secp256k1_ge *)(puVar35 + (uVar23 / 0xd) * -0x548));
            if (iVar47 == 0) goto LAB_00113e9d;
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar41,(secp256k1_gej *)(auStack_800 + lVar9),
                       (secp256k1_fe *)0x0);
            iVar47 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar41,
                                (secp256k1_ge *)(puVar35 + (uVar23 / 0xd) * -0x548));
            if (iVar47 == 0) goto LAB_00113ea2;
            lVar9 = lVar9 + 0x98;
            puVar35 = puVar35 + 0xd0;
            uVar23 = uVar23 + 2;
          } while (lVar9 != 0x7b8);
          lVar9 = 0x68;
          psVar11 = &sStack_870;
          psVar12 = (secp256k1_gej *)(auStack_800 + 0x98);
          do {
            psVar41 = (secp256k1_context *)auStack_1050;
            secp256k1_ge_neg((secp256k1_ge *)psVar41,(secp256k1_ge *)(auStack_d50 + lVar9));
            iVar47 = secp256k1_ge_eq_var((secp256k1_ge *)psVar41,psVar11);
            if (iVar47 == 0) goto LAB_00113ea7;
            secp256k1_gej_neg((secp256k1_gej *)asStack_14d0,psVar12);
            psVar41 = asStack_14d0;
            iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
            if (iVar47 == 0) goto LAB_00113eac;
            lVar9 = lVar9 + 0x68;
            psVar12 = psVar12 + 1;
            psVar11 = psVar11 + -1;
          } while (lVar9 != 0x548);
          puVar35 = (undefined1 *)0x1;
          uStack_1b20 = 0x68;
          psStack_1af0 = (secp256k1_gej *)0x0;
LAB_00111f68:
          lVar9 = (long)puVar35 * 0x98;
          pFStack_1b30 = (FILE *)0x0;
          puStack_1af8 = auStack_d50;
          puStack_1b00 = puVar35;
          while( true ) {
            bVar51 = true;
            if ((ulong)num_cores != 1) {
              psStack_1af0 = (secp256k1_gej *)((long)psStack_1af0[-0x2a150f76858d35].y.n + 0x23);
              bVar51 = (uint32_t)
                       (((ulong)psStack_1af0 >> 0x20 ^ (ulong)psStack_1af0 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar51) break;
LAB_001120b9:
            pFStack_1b30 = (FILE *)((long)&pFStack_1b30->_flags + 1);
            puStack_1af8 = puStack_1af8 + 0x68;
            if ((int)pFStack_1b30 == 0xd) goto code_r0x001120d3;
          }
          iVar47 = 0;
          puVar31 = puStack_1af8;
          __stream = pFStack_1b30;
          while( true ) {
            auStack_1a50._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1a80._0_4_ = (int)pFStack_1b30;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1ac0._8_8_ = auStack_1050;
            auStack_1ac0._0_8_ = auStack_17d0;
            auStack_1ab0._0_8_ = asStack_14d0;
            na = auStack_1a50;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1ac0,(secp256k1_gej *)auStack_1970,1,
                       (secp256k1_gej *)(auStack_800 + lVar9),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1a80);
            iVar6 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1970,
                               (secp256k1_ge *)(puVar31 + ((ulong)__stream / 0xd) * -0x548));
            if (iVar6 == 0) break;
            iVar47 = iVar47 + 1;
            puVar31 = puVar31 + uStack_1b20;
            __stream = (FILE *)((long)&__stream->_flags + (long)puStack_1b00);
            puVar35 = puStack_1b00;
            if (iVar47 == 0xd) goto LAB_001120b9;
          }
          main_cold_56();
LAB_00113e33:
          main_cold_1();
LAB_001113b1:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_001113be;
        }
        goto LAB_00113eca;
      }
      goto LAB_00113eed;
    }
    goto LAB_00113ee8;
  }
LAB_00113ee3:
  main_cold_73();
LAB_00113ee8:
  main_cold_72();
LAB_00113eed:
  main_cold_71();
LAB_00113ef2:
  main_cold_10();
LAB_00113ef7:
  main_cold_11();
LAB_00113efc:
  main_cold_12();
LAB_00113f01:
  main_cold_13();
LAB_00113f06:
  main_cold_14();
LAB_00113f0b:
  main_cold_15();
LAB_00113f10:
  main_cold_48();
LAB_00113f15:
  main_cold_16();
LAB_00113f1a:
  main_cold_17();
LAB_00113f1f:
  main_cold_18();
LAB_00113f24:
  main_cold_19();
LAB_00113f29:
  main_cold_20();
LAB_00113f2e:
  main_cold_47();
LAB_00113f33:
  main_cold_46();
LAB_00113f38:
  main_cold_45();
LAB_00113f3d:
  main_cold_44();
LAB_00113f42:
  main_cold_43();
LAB_00113f47:
  main_cold_42();
LAB_00113f4c:
  main_cold_21();
LAB_00113f51:
  main_cold_41();
LAB_00113f56:
  main_cold_22();
LAB_00113f5b:
  main_cold_40();
LAB_00113f60:
  main_cold_23();
LAB_00113f65:
  main_cold_39();
LAB_00113f6a:
  main_cold_38();
LAB_00113f6f:
  main_cold_24();
LAB_00113f74:
  main_cold_25();
LAB_00113f79:
  main_cold_26();
LAB_00113f7e:
  main_cold_27();
LAB_00113f83:
  main_cold_37();
LAB_00113f88:
  main_cold_36();
LAB_00113f8d:
  main_cold_35();
LAB_00113f92:
  main_cold_34();
LAB_00113f97:
  main_cold_28();
LAB_00113f9c:
  main_cold_29();
LAB_00113fa1:
  main_cold_30();
LAB_00113fa6:
  main_cold_31();
LAB_00113fab:
  main_cold_33();
LAB_00113fb0:
  main_cold_32();
  lVar9 = 0;
  do {
    uVar44 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar19 = secp256k1_test_state[1] << 0x11;
    uVar18 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar23 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar18;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar23;
    secp256k1_test_state[3] = uVar23 << 0x2d | uVar23 >> 0x13;
    secp256k1_test_state[2] = uVar18 ^ uVar19;
    (psVar41->ecmult_gen_ctx).ge_offset.x.n[lVar9 + -1] = uVar44;
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 4);
  return;
code_r0x001120d3:
  puVar35 = puVar35 + 1;
  uStack_1b20 = uStack_1b20 + 0x68;
  if (puVar35 == (undefined1 *)0xd) goto code_r0x001120e6;
  goto LAB_00111f68;
code_r0x001120e6:
  lVar9 = 0;
  do {
    lVar30 = 0;
    do {
      bVar51 = true;
      if ((ulong)num_cores != 1) {
        psStack_1af0 = (secp256k1_gej *)((long)psStack_1af0[-0x2a150f76858d35].y.n + 0x23);
        bVar51 = (uint32_t)
                 (((ulong)psStack_1af0 >> 0x20 ^ (ulong)psStack_1af0 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar51) {
        auStack_1ac0._0_4_ = (int)lVar9;
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
        psVar11 = (secp256k1_ge *)(auStack_d50 + lVar30 * 0x68);
        psVar41 = asStack_14d0;
        secp256k1_ecmult_const((secp256k1_gej *)psVar41,psVar11,(secp256k1_scalar *)auStack_1ac0);
        uVar29 = (int)lVar30 * (int)lVar9;
        psVar37 = (secp256k1_ge *)
                  (auStack_d50 + (ulong)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc)) * 0x68);
        iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar41,psVar37);
        if (iVar47 == 0) goto LAB_00113eb1;
        if (lVar30 != 0 && lVar9 != 0) {
          psVar25 = (secp256k1_context *)auStack_1970;
          psVar41 = psVar25;
          iVar47 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar11,(secp256k1_fe *)0x0,
                              (secp256k1_scalar *)auStack_1ac0,0);
          if (iVar47 == 0) goto LAB_00113eb6;
          iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar37);
          if (iVar47 == 0) goto LAB_00113ebb;
          do {
            psVar25 = (secp256k1_context *)auStack_17d0;
            testutil_random_fe((secp256k1_fe *)psVar25);
            secp256k1_fe_verify((secp256k1_fe *)psVar25);
            if (iStack_17a4 == 0) {
              main_cold_52();
              goto LAB_00113e70;
            }
          } while ((SUB168(auStack_17c0 | auStack_17d0,8) == 0 &&
                   SUB168(auStack_17c0 | auStack_17d0,0) == 0) &&
                   CONCAT44(auStack_17ac,auStack_17b0) == 0);
          secp256k1_fe_mul((secp256k1_fe *)auStack_1050,(secp256k1_fe *)auStack_17d0,
                           (secp256k1_fe *)psVar11);
          psVar41 = (secp256k1_context *)auStack_1970;
          na = (uchar *)0x0;
          psVar25 = psVar41;
          iVar47 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar41,(secp256k1_fe *)auStack_1050,
                              (secp256k1_fe *)auStack_17d0,(secp256k1_scalar *)auStack_1ac0,0);
          if (iVar47 == 0) goto LAB_00113ec0;
          iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar41,(secp256k1_fe *)psVar37);
          if (iVar47 == 0) goto LAB_00113ec5;
        }
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0xd);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xd);
  auStack_1a50._56_8_ = &psStack_1b10->error_callback;
  scratch = secp256k1_scratch_create((secp256k1_callback *)auStack_1a50._56_8_,0x1000);
  auStack_1a50._72_8_ = 0;
  uStack_19b8 = 0;
  psStack_1998 = scratch;
  do {
    auStack_1a50._88_8_ = 0;
    do {
      auStack_1a50._80_8_ = 0;
      do {
        uStack_19c8 = 0;
        do {
          bVar51 = true;
          if ((ulong)num_cores != 1) {
            uStack_19b8 = uStack_19b8 + 0xe7037ed1a0b428db;
            bVar51 = (uint32_t)
                     ((uStack_19b8 >> 0x20 ^ uStack_19b8 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar51) {
            puStack_19a8 = (uint64_t *)(auStack_d50 + uStack_19c8 * 0x68);
            p_Stack_19b0 = (_func_void_char_ptr_void_ptr *)
                           (uStack_19c8 * auStack_1a50._72_8_ + auStack_1a50._80_8_);
            p_Var28 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              asStack_14d0[0].ecmult_gen_ctx.built = (int)auStack_1a50._72_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
              asStack_14d0[0].ecmult_gen_ctx.scalar_offset = (int)auStack_1a50._88_8_;
              secp256k1_scalar_verify(&asStack_14d0[0].ecmult_gen_ctx.scalar_offset);
              auStack_1a50._0_4_ = (int)auStack_1a50._80_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
              puVar36 = puStack_19a8;
              psVar11 = &asStack_14d0[0].ecmult_gen_ctx.ge_offset;
              for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
                (psVar11->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar52 * -2 + 1;
                psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar52 * -2 + 1) * 8);
              }
              p_Stack_19a0 = p_Var28;
              puVar36 = (uint64_t *)(auStack_d50 + (long)p_Var28 * 0x68);
              psVar20 = &asStack_14d0[0].ecmult_gen_ctx.proj_blind;
              for (pvVar21 = (void *)0xd; pvVar21 != (void *)0x0;
                  pvVar21 = (void *)((long)pvVar21 + -1)) {
                psVar20->n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar52 * -2 + 1;
                psVar20 = (secp256k1_fe *)((long)psVar20 + ((ulong)bVar52 * -2 + 1) * 8);
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_17d0);
              if (scratch == (secp256k1_scratch *)0x0) {
LAB_0011252e:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)auStack_17d0,(secp256k1_scalar *)auStack_1a50,
                           (secp256k1_ecmult_multi_callback *)asStack_14d0,pvVar21,(size_t)na);
              }
              else {
                sVar14 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1a50._56_8_,scratch,6);
                pvVar21 = (void *)0x1;
                na = "\x01";
                uVar23 = 0;
                do {
                  if (pvVar21 == (void *)0xd) break;
                  if (pvVar21 < (void *)0xd) {
                    uVar18 = *(ulong *)na;
                  }
                  else {
                    uVar18 = 0;
                  }
                  bVar51 = false;
                  uVar19 = 0x7f / (ulong)((int)pvVar21 + 1);
                  uVar33 = (0x98L << ((byte)pvVar21 & 0x3f)) + uVar19 * 8 + 0x118;
                  if (uVar33 <= sVar14) {
                    uVar19 = (sVar14 - uVar33) / (uVar19 * 8 + 0x108);
                    bVar51 = uVar18 <= uVar19;
                    if (!bVar51) {
                      uVar18 = uVar19;
                    }
                    if (uVar23 < uVar18) {
                      uVar23 = uVar18;
                    }
                  }
                  na = na + 8;
                  pvVar21 = (void *)((long)pvVar21 + 1);
                } while (bVar51);
                if (uVar23 == 0) goto LAB_0011252e;
                sVar14 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1a50._56_8_,scratch,5);
                pvVar21 = (void *)(sVar14 - 0xe18);
                bVar51 = pvVar21 < (void *)0xfffffffffffff8f4;
                if (sVar14 < 0x70c) {
                  bVar51 = uVar23 != 1;
                }
                uVar23 = (ulong)bVar51 + 1;
                if (sVar14 < 0x70c) goto LAB_0011252e;
                uStack_1978 = (ulong)(pvVar21 < (void *)0xfffffffffffff8f4);
                uStack_1b28 = 2;
                puStack_1980 = (undefined1 *)(2 - uStack_1978);
                puVar35 = (undefined1 *)0x0;
                uStack_1990 = uVar23;
                do {
                  uVar18 = uVar23;
                  if (uStack_1b28 < uVar23) {
                    uVar18 = uStack_1b28;
                  }
                  lVar9 = (long)puVar35 << ((byte)uStack_1978 & 0x3f);
                  auStack_1a50._64_8_ = auStack_1a50;
                  if (puVar35 != (undefined1 *)0x0) {
                    auStack_1a50._64_8_ = (secp256k1_scalar *)0x0;
                  }
                  psVar12 = (secp256k1_gej *)0x0;
                  psVar34 = (secp256k1_scalar *)auStack_1a50._64_8_;
                  do {
                    psVar24 = (secp256k1_scalar *)((ulong)psVar34 & 0xffffffff);
                    bVar2 = scratch->magic[(long)(psVar12->x).n];
                    bVar3 = *(byte *)((long)psVar12[0x1e14].y.n + 0x14);
                    psVar34 = (secp256k1_scalar *)(ulong)((uint)bVar2 - (uint)bVar3);
                    if (bVar2 == bVar3) {
                      psVar34 = psVar24;
                    }
                    iVar47 = (int)psVar34;
                    if (bVar2 != bVar3) goto LAB_00112642;
                    psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
                  } while (psVar12 != (secp256k1_gej *)0x8);
                  iVar47 = 0;
LAB_00112642:
                  if (iVar47 == 0) {
                    puStack_1af8 = (undefined1 *)scratch->alloc_size;
                  }
                  else {
                    (*(psStack_1b10->error_callback).fn)
                              ("invalid scratch space",(psStack_1b10->error_callback).data);
                    puStack_1af8 = (undefined1 *)0x0;
                  }
                  puStack_1b00 = puVar35;
                  secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1050);
                  uVar1 = auStack_1a50._56_8_;
                  if (uStack_1b28 == 0 && puVar35 != (undefined1 *)0x0) {
                    cVar46 = '\0';
                  }
                  else {
                    psStack_1af0 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)auStack_1a50._56_8_,scratch,
                                              uVar18 * 0x98);
                    psStack_1988 = (secp256k1_xonly_pubkey *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)uVar1,scratch,uVar18 * 4);
                    pvVar21 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,scratch,uVar18 * 0xc0);
                    auStack_1ac0._0_8_ = pvVar21;
                    pvVar15 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,scratch,uVar18 * 0x1a0);
                    auStack_1ac0._8_8_ = pvVar15;
                    pvVar16 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,scratch,uVar18 * 0x410);
                    psVar43 = psStack_1988;
                    auStack_1ab0._0_8_ = pvVar16;
                    auVar53._0_4_ =
                         -(uint)((int)psStack_1af0 == 0 && (int)((ulong)psStack_1af0 >> 0x20) == 0);
                    auVar53._4_4_ =
                         -(uint)((int)psStack_1988 == 0 && (int)((ulong)psStack_1988 >> 0x20) == 0);
                    auVar53._8_4_ = -(uint)((int)pvVar21 == 0 && (int)((ulong)pvVar21 >> 0x20) == 0)
                    ;
                    auVar53._12_4_ =
                         -(uint)((int)pvVar15 == 0 && (int)((ulong)pvVar15 >> 0x20) == 0);
                    iVar47 = movmskps((int)psVar12,auVar53);
                    psVar12 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44((int)((ulong)psVar12 >> 0x20),iVar47) >> 8),
                                       iVar47 != 0 || pvVar16 == (void *)0x0);
                    uStack_19bc = (int)psVar12;
                    if (iVar47 == 0 && pvVar16 != (void *)0x0) {
                      if (uStack_1b28 != 0) {
                        psVar11 = &asStack_14d0[0].ecmult_gen_ctx.ge_offset + lVar9;
                        sVar14 = 0;
                        psVar12 = psStack_1af0;
                        do {
                          *(undefined4 *)(psVar43->data + sVar14 * 4) =
                               *(undefined4 *)
                                ((long)asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n +
                                sVar14 * 4 + lVar9 * 4 + -8);
                          psVar37 = psVar11;
                          psVar42 = (secp256k1_ge *)auStack_1970;
                          for (lVar30 = 0xd; lVar30 != 0; lVar30 = lVar30 + -1) {
                            (psVar42->x).n[0] = (psVar37->x).n[0];
                            psVar37 = (secp256k1_ge *)((long)psVar37 + ((ulong)bVar52 * -2 + 1) * 8)
                            ;
                            psVar42 = (secp256k1_ge *)((long)psVar42 + (ulong)bVar52 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar12,(secp256k1_ge *)auStack_1970);
                          sVar14 = sVar14 + 1;
                          psVar12 = psVar12 + 1;
                          psVar11 = psVar11 + 1;
                        } while (uVar18 != sVar14);
                      }
                      psVar12 = psStack_1af0;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1ac0,
                                 (secp256k1_gej *)auStack_1050,uVar18,psStack_1af0,
                                 (secp256k1_scalar *)psVar43,(secp256k1_scalar *)auStack_1a50._64_8_
                                );
                      na = psVar43->data;
                    }
                    scratch = psStack_1998;
                    secp256k1_scratch_apply_checkpoint
                              ((secp256k1_callback *)auStack_1a50._56_8_,psStack_1998,
                               (size_t)puStack_1af8);
                    cVar46 = (char)uStack_19bc;
                    uVar23 = uStack_1990;
                  }
                  puVar35 = puStack_1b00;
                  if (cVar46 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_17d0,(secp256k1_gej *)auStack_17d0,
                               (secp256k1_gej *)auStack_1050,&psVar12->x);
                    uStack_1b28 = uStack_1b28 - uVar18;
                  }
                  puVar35 = puVar35 + 1;
                } while (cVar46 == '\0' && puVar35 != puStack_1980);
              }
              p_Var28 = p_Stack_19a0;
              uVar29 = (int)p_Stack_19a0 * auStack_1a50._88_4_ + (int)p_Stack_19b0;
              psVar25 = (secp256k1_context *)auStack_17d0;
              iVar47 = secp256k1_gej_eq_ge_var
                                 ((secp256k1_gej *)psVar25,
                                  (secp256k1_ge *)
                                  (auStack_d50 +
                                  (ulong)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc)) * 0x68));
              if (iVar47 == 0) goto LAB_00113e98;
              p_Var28 = p_Var28 + 1;
            } while (p_Var28 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          uStack_19c8 = uStack_19c8 + 1;
        } while (uStack_19c8 != 0xd);
        auStack_1a50._80_8_ = auStack_1a50._80_8_ + 1;
      } while (auStack_1a50._80_8_ != 0xd);
      auStack_1a50._88_8_ = auStack_1a50._88_8_ + 1;
    } while (auStack_1a50._88_8_ != 0xd);
    auStack_1a50._72_8_ = auStack_1a50._72_8_ + 1;
  } while (auStack_1a50._72_8_ != 0xd);
  secp256k1_scratch_destroy((secp256k1_callback *)auStack_1a50._56_8_,scratch);
  iVar47 = 1;
  pFStack_1b30 = (FILE *)0x0;
  do {
    iVar6 = 1;
    do {
      bVar51 = true;
      if ((ulong)num_cores != 1) {
        pFStack_1b30 = (FILE *)((long)pFStack_1b30 + 0xe7037ed1a0b428db);
        bVar51 = (uint32_t)
                 (((ulong)pFStack_1b30 >> 0x20 ^ (ulong)pFStack_1b30 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar51) {
        auStack_1970._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_1a50._0_4_ = iVar47;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
          auStack_1ac0._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
          auStack_1050 = (undefined1  [16])0x0;
          auStack_1040._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1040[0xf] = (char)iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
          auStack_17d0 = (undefined1  [16])0x0;
          auStack_17c0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_17c0[0xf] = (char)iVar47;
          psVar41 = psStack_1b10;
          iVar7 = secp256k1_ecdsa_sign
                            (psStack_1b10,(secp256k1_ecdsa_signature *)asStack_14d0,auStack_17d0,
                             auStack_1050,secp256k1_nonce_function_smallint,auStack_1970);
          if (iVar7 != 1) goto LAB_00113ef2;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1a80,(uchar *)asStack_14d0,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_19f0,
                     (uchar *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          psVar41 = (secp256k1_context *)auStack_1ae0;
          r_from_k((secp256k1_scalar *)psVar41,(secp256k1_ge *)auStack_d50,auStack_1970._0_4_,
                   (int *)0x0);
          if (auStack_1a80._0_4_ != auStack_1ae0._0_4_) goto LAB_00113ef7;
          uVar4 = auStack_1970._0_4_;
          uVar32 = auStack_19f0._0_4_ * auStack_1970._0_4_;
          uVar29 = auStack_1a80._0_4_ * iVar6 + iVar47;
          na = (uchar *)(ulong)((uVar29 / 0xd) * 3);
          iVar7 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) != iVar7) {
            uVar29 = (0xd - auStack_19f0._0_4_) * auStack_1970._0_4_;
            psVar41 = (secp256k1_context *)(ulong)((uVar29 / 0xd) * 3);
            if (uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar7) goto LAB_00113efc;
          }
          if ((int)auStack_1970._0_4_ < iVar26) break;
          iVar26 = auStack_1970._0_4_ + 1;
          auStack_1970._0_4_ = iVar26;
        } while ((int)uVar4 < 0xc);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    iVar47 = iVar47 + 1;
  } while (iVar47 != 0xd);
  uStack_1b28._0_4_ = 1;
  uStack_1b20 = 0;
  do {
    iVar47 = 1;
    do {
      iVar6 = 1;
      do {
        puVar35 = (undefined1 *)0x1;
        do {
          bVar51 = true;
          if ((ulong)num_cores != 1) {
            uStack_1b20 = uStack_1b20 + 0xe7037ed1a0b428db;
            bVar51 = (uint32_t)
                     ((uStack_1b20 >> 0x20 ^ uStack_1b20 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar51) {
            auStack_19f0._0_4_ = (uint)uStack_1b28;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            auStack_1a80._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1a50._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1ac0._0_4_ = (int)puVar35;
            puStack_1b00 = puVar35;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
            uVar29 = 0;
            iVar26 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_14d0,(secp256k1_ge *)auStack_d50,iVar26,
                       (int *)0x0);
              if (iVar47 == asStack_14d0[0].ecmult_gen_ctx.built) {
                auStack_1ae0._0_4_ = iVar26;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1ae0,(secp256k1_scalar *)auStack_1ae0,
                           (secp256k1_scalar *)auStack_19f0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1a80,
                           (secp256k1_scalar *)auStack_1ac0);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1b14,
                           (secp256k1_scalar *)auStack_1a50);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                uVar29 = uVar29 | (uchar  [4])auStack_1ae0._0_4_ == auStack_1b14;
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != 0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)auStack_1050,(secp256k1_scalar *)auStack_1a80,
                       (secp256k1_scalar *)auStack_19f0);
            puVar35 = puStack_1b00;
            puVar38 = (undefined8 *)(auStack_d50 + (long)puStack_1b00 * 0x68);
            psVar41 = asStack_14d0;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar1 = *puVar38;
              (psVar41->ecmult_gen_ctx).built = (int)uVar1;
              (psVar41->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar38 = puVar38 + (ulong)bVar52 * -2 + 1;
              psVar41 = (secp256k1_context *)((long)psVar41 + (ulong)bVar52 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_17d0,(secp256k1_ge *)asStack_14d0);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1970 = (undefined1  [16])0x0;
            auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1960[0xf] = (char)iVar6;
            psVar41 = psStack_1b10;
            uVar32 = secp256k1_ecdsa_verify
                               (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_1050,auStack_1970,
                                (secp256k1_pubkey *)auStack_17d0);
            if (((uint)uStack_1b28 < 7 & uVar29) != uVar32) goto LAB_00113f01;
          }
          puVar35 = puVar35 + 1;
        } while (puVar35 != (undefined1 *)0xd);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
      iVar47 = iVar47 + 1;
    } while (iVar47 != 0xd);
    uStack_1b28._0_4_ = (uint)uStack_1b28 + 1;
  } while ((uint)uStack_1b28 != 0xd);
  iVar47 = 1;
  uStack_1b20 = 0;
  do {
    iVar6 = 1;
    do {
      bVar51 = true;
      if ((ulong)num_cores != 1) {
        uStack_1b20 = uStack_1b20 + 0xe7037ed1a0b428db;
        bVar51 = (uint32_t)
                 ((uStack_1b20 >> 0x20 ^ uStack_1b20 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar51) {
        auStack_1a50._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_19f0._0_4_ = iVar47;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
          auStack_1a80._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
          auStack_1970 = (undefined1  [16])0x0;
          auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1960[0xf] = (char)iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
          auStack_1ac0 = (undefined1  [16])0x0;
          auStack_1ab0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1ab0[0xf] = (char)iVar47;
          secp256k1_ecdsa_sign_recoverable
                    (psStack_1b10,(secp256k1_ecdsa_recoverable_signature *)asStack_14d0,auStack_1ac0
                     ,auStack_1970,secp256k1_nonce_function_smallint,auStack_1a50);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1ae0,(uchar *)asStack_14d0,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b14,
                     (uchar *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          bVar2 = (byte)asStack_14d0[0].ecmult_gen_ctx.ge_offset.y.n[1];
          psVar41 = (secp256k1_context *)auStack_1b04;
          r_from_k((secp256k1_scalar *)psVar41,(secp256k1_ge *)auStack_d50,auStack_1a50._0_4_,
                   (int *)&sStack_1ae4);
          auVar27 = auStack_1b14;
          if ((undefined1  [4])auStack_1ae0._0_4_ != auStack_1b04) goto LAB_00113f06;
          lVar9 = (long)(int)auStack_1a50._0_4_;
          uVar29 = (int)auStack_1b14 * auStack_1a50._0_4_;
          uVar32 = auStack_1ae0._0_4_ * iVar6 + iVar47;
          iVar7 = uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc);
          if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar7) &&
             (uVar29 = (0xd - (int)auStack_1b14) * auStack_1a50._0_4_,
             uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar7)) goto LAB_00113f0b;
          uVar29 = (uint)(sStack_1ae4 != 0) * 2;
          lVar30 = lVar9 * 0x68;
          auStack_17b0 = *(uchar (*) [4])(auStack_d00 + lVar30);
          auStack_17ac = *(uchar (*) [4])(auStack_cfc + lVar30);
          iStack_17a8 = aiStack_cf8[lVar9 * 0x1a];
          iStack_17a4 = aiStack_cf8[lVar9 * 0x1a + 1];
          auStack_17d0._8_8_ = auStack_d20[lVar9 * 0xd + 1];
          auStack_17d0._0_8_ = auStack_d20[lVar9 * 0xd];
          auStack_17c0._8_8_ = *(undefined8 *)(auStack_d08 + lVar30);
          auStack_17c0._0_8_ = *(undefined8 *)(auStack_d10 + lVar30);
          psVar41 = (secp256k1_context *)auStack_17d0;
          secp256k1_fe_normalize((secp256k1_fe *)psVar41);
          uVar32 = (int)auVar27 * auStack_1a50._0_4_;
          secp256k1_fe_verify((secp256k1_fe *)psVar41);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) == iVar7) {
            if (iStack_17a4 == 0) goto LAB_00113f10;
            uVar29 = auStack_17d0._0_4_ & 1 | uVar29;
          }
          else {
            if (iStack_17a4 == 0) goto LAB_00113f15;
            uVar29 = (auStack_17d0._0_4_ & 1 | uVar29) ^ 1;
          }
          if (uVar29 != bVar2) goto LAB_00113f1a;
          secp256k1_ecdsa_recoverable_signature_convert
                    (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_1050,
                     (secp256k1_ecdsa_recoverable_signature *)asStack_14d0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1ae0,(uchar *)auStack_1050,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b14,(uchar *)&uStack_1030,(int *)0x0);
          psVar41 = (secp256k1_context *)auStack_1b04;
          r_from_k((secp256k1_scalar *)psVar41,(secp256k1_ge *)auStack_d50,auStack_1a50._0_4_,
                   (int *)0x0);
          if ((undefined1  [4])auStack_1ae0._0_4_ != auStack_1b04) goto LAB_00113f1f;
          uVar4 = auStack_1a50._0_4_;
          uVar32 = (int)auStack_1b14 * auStack_1a50._0_4_;
          uVar29 = auStack_1ae0._0_4_ * iVar6 + iVar47;
          na = (uchar *)(ulong)((uVar29 / 0xd) * 3);
          iVar7 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) != iVar7) {
            uVar29 = (0xd - (int)auStack_1b14) * auStack_1a50._0_4_;
            psVar41 = (secp256k1_context *)(ulong)((uVar29 / 0xd) * 3);
            if (uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar7) goto LAB_00113f24;
          }
          if ((int)auStack_1a50._0_4_ < iVar26) break;
          iVar26 = auStack_1a50._0_4_ + 1;
          auStack_1a50._0_4_ = iVar26;
        } while ((int)uVar4 < 0xc);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    iVar47 = iVar47 + 1;
  } while (iVar47 != 0xd);
  pFStack_1b30._0_4_ = 1;
  uStack_1b28 = 0;
  do {
    iVar47 = 1;
    do {
      iVar6 = 1;
      do {
        lVar9 = 1;
        do {
          bVar51 = true;
          if ((ulong)num_cores != 1) {
            uStack_1b28 = uStack_1b28 + 0xe7037ed1a0b428db;
            bVar51 = (uint32_t)
                     ((uStack_1b28 >> 0x20 ^ uStack_1b28 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar51) {
            auStack_1ae0._0_4_ = (uint)pFStack_1b30;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
            auStack_19f0._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            auStack_1a80._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1a50._0_4_ = (int)lVar9;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1ac0 = (undefined1  [16])0x0;
            auStack_1ab0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1ab0[0xf] = (char)iVar6;
            uVar29 = 0;
            auVar27[0] = '\0';
            auVar27[1] = '\0';
            auVar27[2] = '\0';
            auVar27[3] = '\0';
            do {
              r_from_k((secp256k1_scalar *)asStack_14d0,(secp256k1_ge *)auStack_d50,(int)auVar27,
                       (int *)0x0);
              if (iVar47 == asStack_14d0[0].ecmult_gen_ctx.built) {
                auStack_1b14 = auVar27;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1b14,
                           (secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b04,(secp256k1_scalar *)auStack_19f0,
                           (secp256k1_scalar *)auStack_1a50);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1b04,(secp256k1_scalar *)auStack_1b04,
                           (secp256k1_scalar *)auStack_1a80);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b04);
                uVar29 = uVar29 | auStack_1b14 == (uchar  [4])auStack_1b04;
              }
              auVar27 = (uchar  [4])((int)auVar27 + 1);
            } while (auVar27 != (uchar  [4])0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
            secp256k1_ecdsa_recoverable_signature_save
                      ((secp256k1_ecdsa_recoverable_signature *)auStack_1050,
                       (secp256k1_scalar *)auStack_19f0,(secp256k1_scalar *)auStack_1ae0,0);
            psVar41 = psStack_1b10;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_17d0,
                       (secp256k1_ecdsa_recoverable_signature *)auStack_1050);
            puVar38 = (undefined8 *)(auStack_d50 + lVar9 * 0x68);
            psVar25 = asStack_14d0;
            for (lVar30 = 0xd; lVar30 != 0; lVar30 = lVar30 + -1) {
              uVar1 = *puVar38;
              (psVar25->ecmult_gen_ctx).built = (int)uVar1;
              (psVar25->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar38 = puVar38 + (ulong)bVar52 * -2 + 1;
              psVar25 = (secp256k1_context *)((long)psVar25 + (ulong)bVar52 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1970,(secp256k1_ge *)asStack_14d0);
            uVar32 = secp256k1_ecdsa_verify
                               (psVar41,(secp256k1_ecdsa_signature *)auStack_17d0,auStack_1ac0,
                                (secp256k1_pubkey *)auStack_1970);
            if (((uint)pFStack_1b30 < 7 & uVar29) != uVar32) goto LAB_00113f29;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0xd);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
      iVar47 = iVar47 + 1;
    } while (iVar47 != 0xd);
    pFStack_1b30._0_4_ = (uint)pFStack_1b30 + 1;
  } while ((uint)pFStack_1b30 != 0xd);
  pFStack_1b30 = (FILE *)0x1;
  puVar35 = auStack_1810;
  puVar31 = auStack_1970;
  do {
    auStack_19f0._0_4_ = (int)pFStack_1b30;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
    auStack_1a80 = (undefined1  [16])0x0;
    auStack_1a70._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1a70[0xf] = (char)pFStack_1b30;
    lVar9 = (long)pFStack_1b30 - 1;
    keypair = (secp256k1_keypair *)
              ((long)(&asStack_14d0[0].ecmult_gen_ctx.ge_offset + -1) + (long)pFStack_1b30 * 0x60);
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_keypair_create(psStack_1b10,keypair,auStack_1a80);
    if (iVar47 == 0) goto LAB_00113f2e;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_ec_pubkey_create
                       (psStack_1b10,(secp256k1_pubkey *)(auStack_1050 + lVar9 * 0x40),auStack_1a80)
    ;
    if (iVar47 == 0) goto LAB_00113f33;
    psVar43 = (secp256k1_xonly_pubkey *)(auStack_17d0 + lVar9 * 0x40);
    pk_parity = (uchar (*) [4])(auStack_1ac0 + lVar9 * 4);
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_keypair_xonly_pub(psStack_1b10,psVar43,(int *)pk_parity,keypair);
    if (iVar47 == 0) goto LAB_00113f38;
    puVar50 = auStack_1970 + lVar9 * 0x20;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,puVar50,psVar43);
    if (iVar47 == 0) goto LAB_00113f3d;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_parse(psStack_1b10,psVar43,puVar50);
    if (iVar47 == 0) goto LAB_00113f42;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,auStack_1a80,psVar43);
    if (iVar47 == 0) goto LAB_00113f47;
    lVar30 = 0;
    do {
      bVar2 = auStack_1a80[lVar30];
      psVar41 = (secp256k1_context *)(ulong)bVar2;
      iVar47 = (uint)(byte)puVar31[lVar30] - (uint)bVar2;
      if (puVar31[lVar30] != bVar2) goto LAB_00113523;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x20);
    iVar47 = 0;
LAB_00113523:
    if (iVar47 != 0) goto LAB_00113f4c;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_from_pubkey
                       (psStack_1b10,psVar43,(int *)auStack_1ae0,
                        (secp256k1_pubkey *)(auStack_1050 + lVar9 * 0x40));
    if (iVar47 == 0) goto LAB_00113f51;
    if ((uchar  [4])auStack_1ae0._0_4_ != *pk_parity) goto LAB_00113f56;
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,auStack_1a80,psVar43);
    if (iVar47 == 0) goto LAB_00113f5b;
    lVar9 = 0;
    do {
      bVar2 = auStack_1a80[lVar9];
      psVar41 = (secp256k1_context *)(ulong)bVar2;
      iVar47 = (uint)(byte)puVar31[lVar9] - (uint)bVar2;
      if (puVar31[lVar9] != bVar2) goto LAB_0011359e;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x20);
    iVar47 = 0;
LAB_0011359e:
    if (iVar47 != 0) goto LAB_00113f60;
    psVar41 = (secp256k1_context *)auStack_1a50;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar41,puVar50);
    auStack_1a50._40_8_ = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar41);
    lVar9 = (long)pFStack_1b30 * 0x68;
    iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar41,(secp256k1_fe *)(auStack_d50 + lVar9));
    if (iVar47 == 0) goto LAB_00113f65;
    auStack_1a50._0_8_ = auStack_d20[(long)pFStack_1b30 * 0xd];
    auStack_1a50._8_8_ = auStack_d20[(long)pFStack_1b30 * 0xd + 1];
    auStack_1a50._16_8_ = *(undefined8 *)(auStack_d10 + lVar9);
    auStack_1a50._24_8_ = *(undefined8 *)(auStack_d08 + lVar9);
    auStack_1a50._32_4_ = *(undefined4 *)(auStack_d00 + lVar9);
    auStack_1a50._36_4_ = *(undefined4 *)(auStack_cfc + lVar9);
    auStack_1a50._44_4_ = aiStack_cf8[(long)pFStack_1b30 * 0x1a + 1];
    auStack_1a50._40_4_ = aiStack_cf8[(long)pFStack_1b30 * 0x1a];
    psVar41 = (secp256k1_context *)auStack_1a50;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar41);
    secp256k1_fe_verify((secp256k1_fe *)psVar41);
    if (auStack_1a50._44_4_ == 0) goto LAB_00113f6a;
    if ((uchar  [4])(auStack_1a50._0_4_ & 1) != *pk_parity) goto LAB_00113f6f;
    if (6 < pFStack_1b30) {
      lVar9 = 0;
      psVar25 = extraout_RDX;
      do {
        psVar41 = (secp256k1_context *)((ulong)psVar25 & 0xffffffff);
        bVar2 = puVar31[lVar9];
        na = (uchar *)(ulong)bVar2;
        bVar3 = puVar35[lVar9];
        psVar25 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar25 = psVar41;
        }
        iVar47 = (int)psVar25;
        if (bVar2 != bVar3) goto LAB_0011368f;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      iVar47 = 0;
LAB_0011368f:
      if (iVar47 != 0) goto LAB_00113f74;
      if (*pk_parity != (uchar  [4])(1U - *(int *)(auStack_1ac0 + (0xc - (long)pFStack_1b30) * 4)))
      goto LAB_00113f79;
    }
    pFStack_1b30 = (FILE *)((long)pFStack_1b30 + 1);
    puVar31 = puVar31 + 0x20;
    puVar35 = puVar35 + -0x20;
  } while (pFStack_1b30 != (FILE *)0xd);
  lVar9 = 0;
  do {
    psVar41 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_parse
                       (psStack_1b10,(secp256k1_xonly_pubkey *)asStack_14d0,
                        invalid_pubkey_bytes[0] + lVar9);
    if (iVar47 != 0) goto LAB_00113f7e;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0xe0);
  iVar47 = 1;
  psVar25 = asStack_14d0;
  psVar43 = (secp256k1_xonly_pubkey *)auStack_1050;
  puVar50 = auStack_17d0;
  lVar9 = 0;
  do {
    auStack_1ac0._0_4_ = iVar47;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    auStack_1970 = (undefined1  [16])0x0;
    auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1960[0xf] = (char)iVar47;
    psVar41 = psStack_1b10;
    iVar6 = secp256k1_keypair_create(psStack_1b10,(secp256k1_keypair *)psVar25,auStack_1970);
    if (iVar6 == 0) goto LAB_00113f83;
    psVar41 = psStack_1b10;
    iVar6 = secp256k1_keypair_xonly_pub
                      (psStack_1b10,psVar43,(int *)(auStack_1a50 + lVar9),
                       (secp256k1_keypair *)psVar25);
    if (iVar6 == 0) goto LAB_00113f88;
    psVar41 = psStack_1b10;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1b10,puVar50,psVar43);
    if (iVar6 == 0) goto LAB_00113f8d;
    lVar9 = lVar9 + 4;
    puVar50 = puVar50 + 0x20;
    psVar43 = psVar43 + 1;
    psVar25 = (secp256k1_context *)&(psVar25->ecmult_gen_ctx).ge_offset.y.magnitude;
    iVar47 = iVar47 + 1;
  } while (lVar9 != 0x30);
  auStack_1ae0._16_8_ = (uchar *)0x0;
  auStack_1ae0._0_8_ = 0x8cb36fda;
  auStack_1ae0._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  uStack_1b20 = 1;
  uStack_1b28 = 0;
  do {
    iVar47 = 0xd - (int)uStack_1b20;
    if ((&iStack_1a54)[uStack_1b20] == 0) {
      iVar47 = (int)uStack_1b20;
    }
    auStack_1b14[0] = '\x01';
    auStack_1b14[1] = '\0';
    auStack_1b14[2] = '\0';
    auStack_1b14[3] = '\0';
    do {
      auStack_1aa0 = (undefined1  [16])0x0;
      auStack_1ab0 = (undefined1  [16])0x0;
      auStack_1ac0 = (undefined1  [16])0x0;
      uStack_1a90 = 0;
      bVar51 = true;
      if ((ulong)num_cores != 1) {
        uStack_1b28 = uStack_1b28 + 0xe7037ed1a0b428db;
        bVar51 = (uint32_t)
                 ((uStack_1b28 >> 0x20 ^ uStack_1b28 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar51) {
        auStack_1ae0._8_8_ = secp256k1_hardened_nonce_function_smallint;
        auStack_1ae0._16_8_ = auStack_1b14;
        auVar27 = (uchar  [4])(0xd - (int)auStack_1b14);
        if ((&iStack_1a54)[(int)auStack_1b14] == 0) {
          auVar27 = auStack_1b14;
        }
        iVar6 = 0;
        do {
          testrand256(auStack_1a80);
          na = (uchar *)(auStack_17d0 + (uStack_1b20 + -1) * 0x20);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1b04,abStack_17f0 + (long)(int)auStack_1b14 * 0x20,
                     auStack_1a80,0x20,(uchar *)(auStack_17d0 + (uStack_1b20 + -1) * 0x20));
          uVar23 = (ulong)(uint)auStack_1b04;
          if (*(int *)(auStack_1ac0 + uVar23 * 4) == 0) {
            uVar29 = (int)auStack_1b04 * iVar47 + (int)auVar27;
            sVar48 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
            sStack_1ae4 = sVar48;
            secp256k1_scalar_verify(&sStack_1ae4);
            auStack_19f0 = (undefined1  [16])0x0;
            auStack_19e0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_19e0[0xf] = (char)sVar48;
            psVar41 = psStack_1b10;
            iVar26 = secp256k1_schnorrsig_sign_custom
                               (psStack_1b10,auStack_1970,auStack_1a80,0x20,
                                (secp256k1_keypair *)
                                ((long)(&asStack_14d0[0].ecmult_gen_ctx.ge_offset + -1) +
                                uStack_1b20 * 0x60),(secp256k1_schnorrsig_extraparams *)auStack_1ae0
                               );
            if (iVar26 == 0) goto LAB_00113f92;
            pbVar22 = abStack_17f0;
            pbVar17 = pbVar22 + (long)(int)auStack_1b14 * 0x20;
            lVar9 = 0;
            do {
              pbVar39 = (byte *)((ulong)pbVar22 & 0xffffffff);
              bVar2 = auStack_1970[lVar9];
              psVar41 = (secp256k1_context *)(ulong)bVar2;
              bVar3 = pbVar17[lVar9];
              na = (uchar *)(ulong)bVar3;
              pbVar22 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar22 = pbVar39;
              }
              iVar26 = (int)pbVar22;
              if (bVar2 != bVar3) goto LAB_001139da;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x20);
            iVar26 = 0;
LAB_001139da:
            if (iVar26 != 0) goto LAB_00113f97;
            lVar9 = 0;
            do {
              pbVar22 = (byte *)((ulong)pbVar17 & 0xffffffff);
              bVar2 = auStack_1950[lVar9];
              bVar3 = auStack_19f0[lVar9];
              psVar41 = (secp256k1_context *)(ulong)bVar3;
              pbVar17 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar17 = pbVar22;
              }
              iVar26 = (int)pbVar17;
              if (bVar2 != bVar3) goto LAB_00113a0d;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x20);
            iVar26 = 0;
LAB_00113a0d:
            if (iVar26 != 0) goto LAB_00113f9c;
            *(undefined4 *)(auStack_1ac0 + uVar23 * 4) = 1;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < 0xd);
      }
      auVar27 = (uchar  [4])((int)auStack_1b14 + 1);
      bVar51 = (int)auStack_1b14 < 0xc;
      auStack_1b14 = auVar27;
    } while (bVar51);
    uStack_1b20 = uStack_1b20 + 1;
  } while (uStack_1b20 != 0xd);
  puStack_1b00 = (undefined1 *)0x1;
  puStack_1af8 = (undefined1 *)0x0;
  do {
    puVar35 = puStack_1b00 + -1;
    lVar9 = (long)puVar35 * 0x20;
    auStack_1a70 = *(undefined1 (*) [16])(auStack_17c0 + lVar9);
    iVar47 = 0xd - (int)puStack_1b00;
    if ((&iStack_1a54)[(long)puStack_1b00] == 0) {
      iVar47 = (int)puStack_1b00;
    }
    psStack_1af0 = (secp256k1_gej *)CONCAT44(psStack_1af0._4_4_,iVar47);
    auStack_1a80._8_8_ = *(undefined8 *)(auStack_17d0 + lVar9 + 8);
    auStack_1a80._0_8_ = *(undefined8 *)(auStack_17d0 + lVar9);
    uStack_1b20 = 1;
    do {
      uVar1 = auStack_1a50._64_8_;
      auStack_1aa0 = (undefined1  [16])0x0;
      auStack_1ab0 = (undefined1  [16])0x0;
      auStack_1ac0 = (undefined1  [16])0x0;
      uStack_1a90 = 0;
      bVar51 = true;
      if ((ulong)num_cores != 1) {
        puStack_1af8 = puStack_1af8 + -0x18fc812e5f4bd725;
        bVar51 = (uint32_t)
                 (((ulong)puStack_1af8 >> 0x20 ^ (ulong)puStack_1af8 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar51) {
        iVar47 = (int)uStack_1b20;
        if (uStack_1b20 < 7) {
          lVar9 = (uStack_1b20 - 1) * 0x20;
          auStack_1960 = *(undefined1 (*) [16])(auStack_17c0 + lVar9);
          auStack_1970._8_8_ = *(undefined8 *)(auStack_17d0 + lVar9 + 8);
          auStack_1970._0_8_ = *(undefined8 *)(auStack_17d0 + lVar9);
          iVar6 = 0xd - iVar47;
          if ((&iStack_1a54)[uStack_1b20] == 0) {
            iVar6 = iVar47;
          }
        }
        else {
          auStack_1970 = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar47 - 7U];
          auStack_1960 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar47 - 7U] + 0x10);
          iVar6 = -1;
        }
        auStack_1a50._65_3_ = 0;
        auStack_1a50[0x40] = iVar6 != -1;
        auStack_1a50._68_4_ = SUB84(uVar1,4);
        iVar47 = 0;
        do {
          testrand256(auStack_19f0);
          na = auStack_1a80;
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1ae0,auStack_1970,auStack_19f0,0x20,na);
          uVar23 = auStack_1ae0._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1ac0 + uVar23 * 4) == 0) {
            uVar29 = (int)auStack_1ae0._0_8_ * (int)psStack_1af0 + iVar6;
            iVar7 = 0;
            iVar26 = 0;
            do {
              if (iVar7 == 0xe) {
                testrand256(auStack_1950);
                uVar32 = 0;
              }
              else {
                auStack_1950 = (undefined1  [16])0x0;
                auStack_1940._0_12_ = SUB1612((undefined1  [16])0x0,0);
                auStack_1940._12_4_ = 0;
                uVar32 = 0;
                if (iVar7 != 0xd && iVar6 != -1) {
                  uVar32 = (uint)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) == iVar7);
                }
              }
              psVar41 = psStack_1b10;
              na = (uchar *)(auStack_1050 + (long)puVar35 * 0x40);
              uVar8 = secp256k1_schnorrsig_verify
                                (psStack_1b10,auStack_1970,auStack_19f0,0x20,
                                 (secp256k1_xonly_pubkey *)(auStack_1050 + (long)puVar35 * 0x40));
              if (uVar8 != uVar32) goto LAB_00113fa1;
              iVar26 = iVar26 + uVar8;
              iVar7 = iVar7 + 1;
            } while (iVar7 != 0xf);
            if (iVar26 != auStack_1a50._64_4_) goto LAB_00113fa6;
            *(undefined4 *)(auStack_1ac0 + uVar23 * 4) = 1;
            iVar47 = iVar47 + 1;
          }
        } while (iVar47 < 0xd);
      }
      uStack_1b20 = uStack_1b20 + 1;
    } while (uStack_1b20 != 0xe);
    puStack_1b00 = puStack_1b00 + 1;
  } while (puStack_1b00 != (undefined1 *)0x7);
  lVar9 = 0x68;
  iVar47 = 1;
  do {
    auStack_1ac0._0_4_ = iVar47;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    auStack_1970 = (undefined1  [16])0x0;
    auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1960[0xf] = (char)iVar47;
    psVar41 = psStack_1b10;
    iVar6 = secp256k1_ellswift_create(psStack_1b10,auStack_1050,auStack_1970,(uchar *)0x0);
    psVar25 = psStack_1b10;
    if (iVar6 == 0) goto LAB_00113fab;
    secp256k1_ellswift_decode(psStack_1b10,(secp256k1_pubkey *)auStack_17d0,auStack_1050);
    psVar41 = asStack_14d0;
    secp256k1_pubkey_load(psVar25,(secp256k1_ge *)psVar41,(secp256k1_pubkey *)auStack_17d0);
    iVar6 = secp256k1_ge_eq_var((secp256k1_ge *)psVar41,(secp256k1_ge *)(auStack_d50 + lVar9));
    if (iVar6 == 0) goto LAB_00113fb0;
    lVar9 = lVar9 + 0x68;
    iVar47 = iVar47 + 1;
  } while (lVar9 != 0x548);
  secp256k1_context_destroy(psStack_1b10);
  iVar47 = count;
  goto joined_r0x00111916;
LAB_00113e70:
  main_cold_4();
LAB_00113e75:
  main_cold_5();
LAB_00113e7a:
  main_cold_6();
LAB_00113e7f:
  main_cold_68();
LAB_00113e84:
  main_cold_67();
LAB_00113e89:
  main_cold_66();
LAB_00113e8e:
  main_cold_7();
LAB_00113e93:
  main_cold_8();
LAB_00113e98:
  main_cold_49();
LAB_00113e9d:
  psVar41 = psVar25;
  main_cold_60();
LAB_00113ea2:
  main_cold_59();
LAB_00113ea7:
  main_cold_58();
LAB_00113eac:
  main_cold_57();
LAB_00113eb1:
  main_cold_55();
LAB_00113eb6:
  psVar25 = psVar41;
  main_cold_54();
LAB_00113ebb:
  main_cold_53();
LAB_00113ec0:
  psVar41 = psVar25;
  main_cold_51();
LAB_00113ec5:
  main_cold_50();
LAB_00113eca:
  main_cold_70();
LAB_00113ecf:
  main_cold_3();
LAB_00113ed4:
  main_cold_69();
LAB_00113ed9:
  main_cold_65();
LAB_00113ede:
  main_cold_64();
  goto LAB_00113ee3;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}